

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

Pubkey * cfd::core::Pubkey::CombinePubkey
                   (Pubkey *__return_storage_ptr__,
                   vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys)

{
  pointer pPVar1;
  pointer this;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> data_list;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_78;
  ByteData local_58;
  ByteData local_40;
  
  local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (pubkeys->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
         _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (pubkeys->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (this != pPVar1) {
    do {
      GetData(&local_40,this);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(&local_78,&local_40);
      if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this = this + 1;
    } while (this != pPVar1);
  }
  WallyUtil::CombinePubkeySecp256k1Ec(&local_58,&local_78);
  Pubkey(__return_storage_ptr__,&local_58);
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::CombinePubkey(const std::vector<Pubkey> &pubkeys) {
  std::vector<ByteData> data_list;
  for (const auto &pubkey : pubkeys) {
    data_list.push_back(pubkey.GetData());
  }
  return Pubkey(WallyUtil::CombinePubkeySecp256k1Ec(data_list));
}